

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

double Cudd_AverageDistance(DdManager *dd)

{
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  DdNode *sentinel;
  DdNodePtr *nodelist;
  DdNode *scan;
  long diff;
  int nvars;
  int slots;
  int j;
  int i;
  double nextmeasured;
  double temeasured;
  double nextsubtotal;
  double tesubtotal;
  double nexttotal;
  double tetotal;
  DdManager *dd_local;
  
  if (dd->size == 0) {
    dd_local = (DdManager *)0x0;
  }
  else {
    nexttotal = 0.0;
    tesubtotal = 0.0;
    nextmeasured = 0.0;
    _j = 0.0;
    for (slots = 0; slots < dd->size; slots = slots + 1) {
      nextsubtotal = 0.0;
      temeasured = 0.0;
      for (nvars = 0; nvars < (int)dd->subtables[slots].slots; nvars = nvars + 1) {
        for (nodelist = (DdNodePtr *)dd->subtables[slots].nodelist[nvars];
            (DdManager *)nodelist != dd; nodelist = (DdNodePtr *)nodelist[1]) {
          local_80 = (long)nodelist - (long)nodelist[2];
          if (local_80 < 0) {
            local_80 = -local_80;
          }
          local_88 = (long)nodelist - ((ulong)nodelist[3] & 0xfffffffffffffffe);
          if (local_88 < 0) {
            local_88 = -local_88;
          }
          nextsubtotal = (double)local_88 + (double)local_80 + nextsubtotal;
          nextmeasured = nextmeasured + 2.0;
          if ((DdManager *)nodelist[1] != dd) {
            local_90 = (long)nodelist - (long)nodelist[1];
            if (local_90 < 0) {
              local_90 = -local_90;
            }
            temeasured = (double)local_90 + temeasured;
            _j = _j + 1.0;
          }
        }
      }
      nexttotal = nextsubtotal + nexttotal;
      tesubtotal = temeasured + tesubtotal;
    }
    temeasured = 0.0;
    for (nvars = 0; nvars < (int)(dd->constants).slots; nvars = nvars + 1) {
      for (nodelist = (DdNodePtr *)(dd->constants).nodelist[nvars]; nodelist != (DdNodePtr *)0x0;
          nodelist = (DdNodePtr *)nodelist[1]) {
        if (nodelist[1] != (DdNodePtr)0x0) {
          local_98 = (long)nodelist - (long)nodelist[1];
          if (local_98 < 0) {
            local_98 = -local_98;
          }
          temeasured = (double)local_98 + temeasured;
          _j = _j + 1.0;
        }
      }
    }
    dd_local = (DdManager *)((nexttotal + temeasured + tesubtotal) / (nextmeasured + _j));
  }
  return (double)dd_local;
}

Assistant:

double
Cudd_AverageDistance(
  DdManager * dd)
{
    double tetotal, nexttotal;
    double tesubtotal, nextsubtotal;
    double temeasured, nextmeasured;
    int i, j;
    int slots, nvars;
    long diff;
    DdNode *scan;
    DdNodePtr *nodelist;
    DdNode *sentinel = &(dd->sentinel);

    nvars = dd->size;
    if (nvars == 0) return(0.0);

    /* Initialize totals. */
    tetotal = 0.0;
    nexttotal = 0.0;
    temeasured = 0.0;
    nextmeasured = 0.0;

    /* Scan the variable subtables. */
    for (i = 0; i < nvars; i++) {
        nodelist = dd->subtables[i].nodelist;
        tesubtotal = 0.0;
        nextsubtotal = 0.0;
        slots = dd->subtables[i].slots;
        for (j = 0; j < slots; j++) {
            scan = nodelist[j];
            while (scan != sentinel) {
                diff = (long) scan - (long) cuddT(scan);
                tesubtotal += (double) ddAbs(diff);
                diff = (long) scan - (long) Cudd_Regular(cuddE(scan));
                tesubtotal += (double) ddAbs(diff);
                temeasured += 2.0;
                if (scan->next != sentinel) {
                    diff = (long) scan - (long) scan->next;
                    nextsubtotal += (double) ddAbs(diff);
                    nextmeasured += 1.0;
                }
                scan = scan->next;
            }
        }
        tetotal += tesubtotal;
        nexttotal += nextsubtotal;
    }

    /* Scan the constant table. */
    nodelist = dd->constants.nodelist;
    nextsubtotal = 0.0;
    slots = dd->constants.slots;
    for (j = 0; j < slots; j++) {
        scan = nodelist[j];
        while (scan != NULL) {
            if (scan->next != NULL) {
                diff = (long) scan - (long) scan->next;
                nextsubtotal += (double) ddAbs(diff);
                nextmeasured += 1.0;
            }
            scan = scan->next;
        }
    }
    nexttotal += nextsubtotal;

    return((tetotal + nexttotal) / (temeasured + nextmeasured));

}